

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O2

void __thiscall
tsbp::Packing2D::Initialize
          (Packing2D *this,vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_> *items,Bin *bin
          )

{
  pointer pRVar1;
  double dVar2;
  allocator_type local_49;
  value_type_conflict2 local_48;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::reserve
            (&this->Items,
             (long)(items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_40,
             (long)(items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 5,0,
             (allocator<unsigned_long> *)&local_48);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this->PlacedItems,&local_40);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(&local_40);
  dVar2 = 0.0;
  for (pRVar1 = (items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pRVar1 != (items->super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>).
                _M_impl.super__Vector_impl_data._M_finish; pRVar1 = pRVar1 + 1) {
    dVar2 = dVar2 + pRVar1->Area;
  }
  this->RemainingItemAreaToPlace = dVar2;
  local_48 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40.m_bits,(long)(bin->super_Rectangle).Dy + 1,&local_48,&local_49);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->PlacedAreaVector,&local_40);
  CLI::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40);
  local_48 = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40.m_bits,(long)(bin->super_Rectangle).Dy + 1,&local_48,&local_49);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&this->DeactivatedAreaVector,&local_40);
  CLI::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_40);
  this->ReducedItemInfeasiblePlacementPoints = 0;
  return;
}

Assistant:

void Packing2D::Initialize(const std::vector<Rectangle>& items, const Bin& bin)
{
    Items.reserve(items.size());
    PlacedItems = boost::dynamic_bitset<>(items.size());
    RemainingItemAreaToPlace = std::accumulate(items.begin(), items.end(), 0.0, [](double volume, const Rectangle& i)
                                               { return volume + i.Area; });
    PlacedAreaVector = std::vector<size_t>(bin.Dy + 1, 0);
    DeactivatedAreaVector = std::vector<size_t>(bin.Dy + 1, 0);
    ReducedItemInfeasiblePlacementPoints = 0;
}